

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::Check(HeapInfo *this)

{
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_00;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_01;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  size_t sVar5;
  size_t sVar6;
  undefined8 in_R8;
  long lVar7;
  long lVar8;
  undefined8 *in_FS_OFFSET;
  anon_class_16_3_167268d5 fn;
  anon_class_16_3_167268d5 fn_00;
  anon_class_16_3_167268d5 fn_01;
  anon_class_16_3_167268d5 fn_02;
  anon_class_16_3_167268d5 fn_03;
  anon_class_16_3_167268d5 fn_04;
  anon_class_16_3_167268d5 fn_05;
  anon_class_16_3_167268d5 fn_06;
  anon_class_16_3_167268d5 fn_07;
  anon_class_16_3_167268d5 fn_08;
  _func_int **local_38;
  size_t heapBlockCount;
  
  BVar4 = Recycler::CollectionInProgress(this->recycler);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6c4,"(!this->recycler->CollectionInProgress())",
                       "!this->recycler->CollectionInProgress()");
    if (!bVar3) goto LAB_00240b38;
    *puVar1 = 0;
  }
  lVar7 = 0x78;
  lVar8 = 0;
  do {
    this_00 = (HeapBucketGroup<SmallAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler + lVar7
              );
    sVar5 = HeapBucketGroup<SmallAllocationBlockAttributes>::Check(this_00);
    sVar6 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_00);
    lVar8 = sVar6 + sVar5 + lVar8;
    lVar7 = lVar7 + 0x380;
  } while (lVar7 != 0xa878);
  lVar7 = 0;
  do {
    this_01 = (HeapBucketGroup<MediumAllocationBlockAttributes> *)
              ((long)&this->mediumHeapBuckets[0].heapBucket.
                      super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                      .
                      super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                      .super_HeapBucket.heapInfo + lVar7);
    sVar5 = HeapBucketGroup<MediumAllocationBlockAttributes>::Check(this_01);
    sVar6 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_01);
    lVar8 = sVar6 + sVar5 + lVar8;
    lVar7 = lVar7 + 0x380;
  } while (lVar7 != 0x6580);
  local_38 = (_func_int **)0x0;
  fn.expectFull = (bool)(char)in_R8;
  fn.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>(bool,bool,Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*,Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newLeafHeapBlockList,
             (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)&stack0xffffffffffffffc8,fn);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_00.expectFull = (bool)(char)in_R8;
  fn_00.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_00._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_00.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>(bool,bool,Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*,Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newNormalHeapBlockList,
             (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)&stack0xffffffffffffffc8,fn_00
            );
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_01.expectFull = (bool)(char)in_R8;
  fn_01.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_01._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_01.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(bool,bool,Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newNormalWithBarrierHeapBlockList,
             (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
             &stack0xffffffffffffffc8,fn_01);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_02.expectFull = (bool)(char)in_R8;
  fn_02.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_02._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_02.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(bool,bool,Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newFinalizableWithBarrierHeapBlockList,
             (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
             &stack0xffffffffffffffc8,fn_02);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_03.expectFull = (bool)(char)in_R8;
  fn_03.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_03._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_03.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>(bool,bool,Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*,Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newFinalizableHeapBlockList,
             (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
             (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)&stack0xffffffffffffffc8,
             fn_03);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_04.expectFull = (bool)(char)in_R8;
  fn_04.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_04._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_04.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>(bool,bool,Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newMediumLeafHeapBlockList,
             (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)&stack0xffffffffffffffc8,fn_04)
  ;
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_05.expectFull = (bool)(char)in_R8;
  fn_05.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_05._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_05.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>(bool,bool,Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newMediumNormalHeapBlockList,
             (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)&stack0xffffffffffffffc8,
             fn_05);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_06.expectFull = (bool)(char)in_R8;
  fn_06.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_06._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_06.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>(bool,bool,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newMediumNormalWithBarrierHeapBlockList,
             (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
             &stack0xffffffffffffffc8,fn_06);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_07.expectFull = (bool)(char)in_R8;
  fn_07.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_07._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_07.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>(bool,bool,Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newMediumFinalizableWithBarrierHeapBlockList,
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
             &stack0xffffffffffffffc8,fn_07);
  lVar8 = lVar8 + (long)local_38;
  local_38 = (_func_int **)0x0;
  fn_08.expectFull = (bool)(char)in_R8;
  fn_08.expectPending = (bool)(char)((ulong)in_R8 >> 8);
  fn_08._10_6_ = (int6)((ulong)in_R8 >> 0x10);
  fn_08.heapBlockCount = (size_t *)&DAT_00000001;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapInfo::Check<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>(bool,bool,Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*,Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((HeapBlockList *)this->newMediumFinalizableHeapBlockList,
             (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)&stack0xffffffffffffffc8
             ,fn_08);
  if (lVar8 + (long)local_38 !=
      this->heapBlockCount[8] + this->heapBlockCount[4] +
      this->heapBlockCount[6] + this->heapBlockCount[2] +
      this->heapBlockCount[7] + this->heapBlockCount[3] +
      this->heapBlockCount[5] + this->heapBlockCount[1] + this->heapBlockCount[9] +
      this->heapBlockCount[10]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x707,"(currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar3) goto LAB_00240b38;
    *puVar1 = 0;
  }
  sVar5 = LargeHeapBucket::Check(&this->largeObjectBucket);
  if (sVar5 != this->heapBlockCount[0xb]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x70b,
                       "(currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType])"
                       ,
                       "currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]"
                      );
    if (!bVar3) {
LAB_00240b38:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
HeapInfo::Check()
{
    Assert(!this->recycler->CollectionInProgress());

    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].Check();
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

    size_t currentLargeHeapBlockCount = 0;
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
#if SMALLBLOCK_MEDIUM_ALLOC
        currentSmallHeapBlockCount += mediumHeapBuckets[i].Check();
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
#else
        currentLargeHeapBlockCount += mediumHeapBuckets[i].Check();
#endif
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += Check(true, false, this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newNormalHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += Check(true, false, this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newFinalizableWithBarrierHeapBlockList);
#endif
    currentSmallHeapBlockCount += Check(true, false, this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += Check(true, false, this->newRecyclerVisitedHostHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += Check(true, false, this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += Check(true, false, this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumFinalizableWithBarrierHeapBlockList);
#endif
    currentSmallHeapBlockCount += Check(true, false, this->newMediumFinalizableHeapBlockList);
#endif

    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];

#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif

    Assert(currentSmallHeapBlockCount == expectedHeapBlockCount);

    currentLargeHeapBlockCount += largeObjectBucket.Check();

    Assert(currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]);
}